

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexVerifierUtil.cpp
# Opt level: O3

int tcu::TexVerifierUtil::wrap(WrapMode mode,int c,int size)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = c;
  switch(mode) {
  case CLAMP_TO_EDGE:
    iVar2 = size + -1;
    if (c < size + -1) {
      iVar2 = c;
    }
    iVar1 = 0;
    if (-1 < c) {
      iVar1 = iVar2;
    }
    return iVar1;
  case CLAMP_TO_BORDER:
    if (c < size) {
      size = c;
    }
    iVar2 = -1;
    if (-2 < c) {
      iVar2 = size;
    }
    return iVar2;
  case REPEAT_GL:
  case REPEAT_CL:
    return (c % size >> 0x1f & size) + c % size;
  case MIRRORED_REPEAT_GL:
  case MIRRORED_REPEAT_CL:
    goto switchD_019cc16e_caseD_4;
  case MIRRORED_ONCE:
    iVar2 = size;
    if (c < size) {
      iVar2 = c;
    }
    if (c < -size) {
      iVar2 = -size;
    }
switchD_019cc16e_caseD_4:
    iVar2 = iVar2 % (size * 2);
    uVar3 = (iVar2 - size) + (iVar2 >> 0x1f & size * 2);
    return ~((int)uVar3 >> 0x1f ^ uVar3) + size;
  default:
    return 0;
  }
}

Assistant:

int wrap (Sampler::WrapMode mode, int c, int size)
{
	switch (mode)
	{
		// \note CL and GL modes are handled identically here, as verification process accounts for
		//		 accuracy differences caused by different methods (wrapping vs. denormalizing first).
		case tcu::Sampler::CLAMP_TO_BORDER:
			return deClamp32(c, -1, size);

		case tcu::Sampler::CLAMP_TO_EDGE:
			return deClamp32(c, 0, size-1);

		case tcu::Sampler::REPEAT_GL:
		case tcu::Sampler::REPEAT_CL:
			return imod(c, size);

		case tcu::Sampler::MIRRORED_ONCE:
			c = deClamp32(c, -size, size);
			// Fall-through

		case tcu::Sampler::MIRRORED_REPEAT_GL:
		case tcu::Sampler::MIRRORED_REPEAT_CL:
			return (size - 1) - mirror(imod(c, 2*size) - size);

		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}